

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * comma_print(unsigned_long n)

{
  code *pcVar1;
  lconv *plVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  
  if (0xf < commaPrintBufIndex) {
    commaPrintBufIndex = '\0';
  }
  pcVar6 = commaPrintBufs[commaPrintBufIndex] + 0x1d;
  plVar2 = localeconv();
  uVar3 = 0;
  if (plVar2 == (lconv *)0x0) {
    cVar4 = '\0';
  }
  else if ((plVar2->thousands_sep == (char *)0x0) || (cVar4 = *plVar2->thousands_sep, cVar4 == '\0')
          ) {
    cVar4 = ',';
  }
  *pcVar6 = '\0';
  iVar5 = 0;
  while( true ) {
    if ((uVar3 != 0) && ((uVar3 / 3) * 3 + iVar5 == 0)) {
      pcVar6[-1] = cVar4;
      pcVar6 = pcVar6 + -1;
    }
    bVar7 = SCARRY4(uVar3,1);
    uVar3 = uVar3 + 1;
    pcVar6[-1] = (byte)(n % 10) | 0x30;
    if (bVar7) break;
    pcVar6 = pcVar6 + -1;
    iVar5 = iVar5 + -1;
    bVar7 = n < 10;
    n = n / 10;
    if (bVar7) {
      commaPrintBufIndex = commaPrintBufIndex + '\x01';
      return pcVar6;
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

char * comma_print(unsigned long n)
{
	int comma = '\0';
	char *p;
	int i = 0;

	if(commaPrintBufIndex>=16)
		commaPrintBufIndex = 0;

	p = &commaPrintBufs[commaPrintBufIndex][sizeof(commaPrintBufs[commaPrintBufIndex])-1];

	if(comma == '\0')
	{
		struct lconv *lcp = localeconv();
		if(lcp != NULL)
		{
			if(lcp->thousands_sep != NULL && *lcp->thousands_sep != '\0')
				comma = *lcp->thousands_sep;
			else
				comma = ',';
		}
	}

	*p = '\0';

	do
	{
		if(i%3 == 0 && i != 0)
			*--p = comma;

		*--p = '0' + n % 10;
		n /= 10;
		i++;
	} while(n != 0);

	commaPrintBufIndex++;
	return p;
}